

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_decoder.h
# Opt level: O2

LumaFrame * __thiscall LumaDecoder::decode(LumaDecoder *this)

{
  char cVar1;
  LumaFrame *this_00;
  EVP_PKEY_CTX *in_RSI;
  
  cVar1 = (**(code **)(*(long *)this + 8))();
  if (cVar1 == '\0') {
    this_00 = (LumaFrame *)0x0;
  }
  else {
    this_00 = (LumaFrame *)(this + 0x260);
    if (*(int *)(this + 0x264) == 0) {
      *(ulong *)(this + 0x260) =
           CONCAT44((int)*(undefined8 *)(*(long *)(this + 0x2b0) + 0x18),
                    (int)((ulong)*(undefined8 *)(*(long *)(this + 0x2b0) + 0x18) >> 0x20));
      *(undefined4 *)(this + 0x268) = 3;
      LumaFrame::init(this_00,in_RSI);
    }
    LumaDecoder::getVpxChannels();
    LumaQuantizer::transformColorSpace
              ((LumaFrame *)(this + 0x18),SUB81(this_00,0),*(float *)(this + 0x2c0));
  }
  return this_00;
}

Assistant:

LumaFrame *decode()
    {
        if (!run())
            return NULL;
            
        if (!m_frame.width)
        {
            m_frame.width = m_vpxFrame->d_w;
            m_frame.height = m_vpxFrame->d_h;
            m_frame.channels = 3;
            m_frame.init();
        }
        
	    getVpxChannels();
        
        m_quant.transformColorSpace(&m_frame, false, m_params.preScaling);
        
        return &m_frame;
    }